

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall CheckBox::setChecked(CheckBox *this,bool checked)

{
  Shape *this_00;
  byte in_SIL;
  long in_RDI;
  Color *in_stack_ffffffffffffffd8;
  Shape *in_stack_ffffffffffffffe0;
  
  if ((in_SIL & 1) == 0) {
    this_00 = (Shape *)(in_RDI + 0x380);
    sf::Shape::getFillColor((Shape *)(in_RDI + 0x228));
    sf::Shape::setFillColor(this_00,in_stack_ffffffffffffffd8);
    *(undefined1 *)(in_RDI + 0x4dc) = 0;
  }
  else {
    sf::Shape::setFillColor(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    *(undefined1 *)(in_RDI + 0x4dc) = 1;
  }
  return;
}

Assistant:

void CheckBox::setChecked(bool checked) {
    if (!checked) {
        check.setFillColor(button.getFillColor());
        _checked = false;
    } else {
        check.setFillColor(checkColor);
        _checked = true;
    }
}